

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O2

rc_size __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  int iVar1;
  rc_data *prVar2;
  uint uVar3;
  ulong uVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_58;
  _Head_base<0UL,_int_*,_false> local_50;
  longdouble local_48;
  longdouble local_3c;
  
  uVar4 = 0;
  uVar3 = 0;
  for (; begin != end; begin = begin + 1) {
    sparse_matrix<int>::column((sparse_matrix<int> *)&local_58,(int)this + 0x10);
    local_48 = (longdouble)0;
    local_3c = local_48;
    lVar5 = in_ST4;
    in_ST4 = in_ST5;
    for (; (tuple<int_*,_std::default_delete<int[]>_>)local_50._M_head_impl !=
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
           local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
        local_50._M_head_impl = local_50._M_head_impl + 2) {
      lVar5 = (longdouble)
              (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl[*local_50._M_head_impl];
      local_48 = (this->pi)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl[local_50._M_head_impl[1]]
                 * lVar5 + local_48;
      local_3c = (this->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl[*local_50._M_head_impl] *
                 lVar5 + local_3c;
      lVar5 = in_ST3;
      in_ST4 = in_ST3;
    }
    (this->R)._M_t.
    super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
    .
    super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
    ._M_head_impl[uVar4].id = (int)uVar4;
    in_ST5 = in_ST4;
    quadratic_cost_type<long_double>::operator()
              ((longdouble *)this->c,(quadratic_cost_type<long_double> *)(ulong)(uint)begin->column,
               (int)x,(bit_array *)local_50._M_head_impl);
    lVar6 = (in_ST0 - local_48) - local_3c;
    prVar2 = (this->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    prVar2[uVar4].value = lVar6;
    iVar1 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[begin->value];
    prVar2[uVar4].f = iVar1;
    if (iVar1 < 0) {
      prVar2[uVar4].value = -lVar6;
      uVar3 = uVar3 + 1;
    }
    uVar4 = uVar4 + 1;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = lVar5;
  }
  return (rc_size)(uVar4 & 0xffffffff | (ulong)uVar3 << 0x20);
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A[std::get<0>(ht)->value]);

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A[begin->value];

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }